

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

int xmlSwitchInputEncodingName(xmlParserCtxtPtr ctxt,xmlParserInputPtr input,char *encoding)

{
  xmlParserErrors code;
  int code_00;
  xmlCharEncodingHandlerPtr in_RAX;
  xmlCharEncodingHandlerPtr handler;
  xmlCharEncodingHandlerPtr local_28;
  
  if (encoding != (char *)0x0) {
    local_28 = in_RAX;
    code = xmlCreateCharEncodingHandler(encoding,0,ctxt->convImpl,ctxt->convCtxt,&local_28);
    if (code == XML_ERR_OK) {
      code_00 = xmlInputSetEncodingHandler(input,local_28);
      if (code_00 == 0) {
        return 0;
      }
      xmlCtxtErrIO(ctxt,code_00,(char *)0x0);
    }
    else if (code == XML_ERR_UNSUPPORTED_ENCODING) {
      xmlWarningMsg(ctxt,XML_ERR_UNSUPPORTED_ENCODING,"Unsupported encoding: %s\n",
                    (xmlChar *)encoding,(xmlChar *)0x0);
    }
    else {
      xmlFatalErr(ctxt,code,encoding);
    }
  }
  return -1;
}

Assistant:

static int
xmlSwitchInputEncodingName(xmlParserCtxtPtr ctxt, xmlParserInputPtr input,
                           const char *encoding) {
    xmlCharEncodingHandlerPtr handler;
    int res;

    if (encoding == NULL)
        return(-1);

    res = xmlCreateCharEncodingHandler(encoding, /* output */ 0,
            ctxt->convImpl, ctxt->convCtxt, &handler);
    if (res == XML_ERR_UNSUPPORTED_ENCODING) {
        xmlWarningMsg(ctxt, XML_ERR_UNSUPPORTED_ENCODING,
                      "Unsupported encoding: %s\n", BAD_CAST encoding, NULL);
        return(-1);
    } else if (res != XML_ERR_OK) {
        xmlFatalErr(ctxt, res, encoding);
        return(-1);
    }

    res  = xmlInputSetEncodingHandler(input, handler);
    if (res != XML_ERR_OK) {
        xmlCtxtErrIO(ctxt, res, NULL);
        return(-1);
    }

    return(0);
}